

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imsg.c
# Opt level: O0

int imsg_composev(imsgbuf *ibuf,u_int32_t type,u_int32_t peerid,pid_t pid,int fd,iovec *iov,
                 int iovcnt)

{
  int iVar1;
  int iVar2;
  imsgbuf *ibuf_00;
  u_int32_t in_ECX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  u_int32_t in_R8D;
  ibuf *in_R9;
  int datalen;
  int i;
  ibuf *wbuf;
  int iVar3;
  u_int16_t datalen_00;
  int local_4;
  
  iVar3 = 0;
  for (iVar1 = 0; iVar1 < (int)wbuf; iVar1 = iVar1 + 1) {
    iVar3 = iVar3 + (int)(&in_R9->entry)[iVar1].tqe_prev;
  }
  ibuf_00 = (imsgbuf *)
            imsg_create((imsgbuf *)CONCAT44(in_ESI,in_EDX),in_ECX,in_R8D,
                        (pid_t)((ulong)in_R9 >> 0x20),(u_int16_t)((ulong)in_R9 >> 0x10));
  if (ibuf_00 == (imsgbuf *)0x0) {
    local_4 = -1;
  }
  else {
    iVar1 = 0;
    while( true ) {
      datalen_00 = (u_int16_t)((uint)iVar1 >> 0x10);
      if ((int)wbuf <= iVar1) break;
      iVar2 = imsg_add(in_R9,ibuf_00,datalen_00);
      if (iVar2 == -1) {
        return -1;
      }
      iVar1 = iVar1 + 1;
    }
    *(u_int32_t *)((ibuf_00->r).buf + 0x28) = in_R8D;
    imsg_close(ibuf_00,(ibuf *)CONCAT26(datalen_00,CONCAT24((short)iVar1,iVar3)));
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int
imsg_composev(struct imsgbuf *ibuf, u_int32_t type, u_int32_t peerid,
    pid_t pid, int fd, const struct iovec *iov, int iovcnt)
{
	struct ibuf	*wbuf;
	int		 i, datalen = 0;

	for (i = 0; i < iovcnt; i++)
		datalen += iov[i].iov_len;

	if ((wbuf = imsg_create(ibuf, type, peerid, pid, datalen)) == NULL)
		return (-1);

	for (i = 0; i < iovcnt; i++)
		if (imsg_add(wbuf, iov[i].iov_base, iov[i].iov_len) == -1)
			return (-1);

	wbuf->fd = fd;

	imsg_close(ibuf, wbuf);

	return (1);
}